

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O2

string * leveldb::DescriptorFileName(string *__return_storage_ptr__,string *dbname,uint64_t number)

{
  long lVar1;
  long in_FS_OFFSET;
  char buf [100];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (number == 0) {
    __assert_fail("number > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/filename.cc"
                  ,0x2c,"std::string leveldb::DescriptorFileName(const std::string &, uint64_t)");
  }
  snprintf(buf,100,"/MANIFEST-%06llu",number);
  std::operator+(__return_storage_ptr__,dbname,buf);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string DescriptorFileName(const std::string& dbname, uint64_t number) {
  assert(number > 0);
  char buf[100];
  snprintf(buf, sizeof(buf), "/MANIFEST-%06llu",
           static_cast<unsigned long long>(number));
  return dbname + buf;
}